

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O2

void dropt_set_strncmp(dropt_context *context,dropt_strncmp_func cmp)

{
  if (context != (dropt_context *)0x0) {
    if (cmp == (dropt_strncmp_func)0x0) {
      cmp = strncmp;
    }
    context->ncmpstr = cmp;
    free_lookup_tables(context);
    return;
  }
  dropt_misuse("No dropt context specified.",
               "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt.c",
               0x61b);
}

Assistant:

void
dropt_set_strncmp(dropt_context* context, dropt_strncmp_func cmp)
{
    if (context == NULL)
    {
        DROPT_MISUSE("No dropt context specified.");
        return;
    }

    if (cmp == NULL) { cmp = dropt_strncmp; }
    context->ncmpstr = cmp;

    /* Changing the sort method invalidates our existing lookup tables. */
    free_lookup_tables(context);
}